

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

qint64 __thiscall
QSocks5SocketEngine::writeDatagram
          (QSocks5SocketEngine *this,char *data,qint64 len,QIpPacketHeader *header)

{
  QSocks5SocketEnginePrivate *this_00;
  QSocks5UdpAssociateData *pQVar1;
  char cVar2;
  bool bVar3;
  SocketError SVar4;
  qint64 qVar5;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  qint64 qStack_a0;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QSocks5SocketEnginePrivate **)(this + 8);
  if (this_00->data == (QSocks5Data *)0x0) {
    QSocks5SocketEnginePrivate::initialize(this_00,UdpAssociateMode);
    latin1.m_data = "0.0.0.0";
    latin1.m_size = 7;
    QString::QString((QString *)&local_58,latin1);
    QHostAddress::QHostAddress((QHostAddress *)&local_78,(QString *)&local_58);
    cVar2 = (**(code **)(*(long *)this + 0x90))(this,&local_78,0);
    QHostAddress::~QHostAddress((QHostAddress *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (cVar2 == '\0') {
      qStack_a0 = -1;
      len = qStack_a0;
      goto LAB_00221c95;
    }
  }
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  QByteArray::reserve((QByteArray *)&local_58,len + 0x10e);
  QByteArray::append((QByteArray *)&local_58,3,'\0');
  bVar3 = qt_socks5_set_host_address_and_port
                    (&header->destinationAddress,header->destinationPort,(QByteArray *)&local_58);
  if (bVar3) {
    QByteArray::QByteArray((QByteArray *)&local_78,data,len);
    QByteArray::append((QByteArray *)&local_58);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
    local_78.d = (Data *)0x0;
    local_78.ptr = (char *)0x0;
    local_78.size = 0;
    QByteArray::operator=((QByteArray *)&local_78,(QByteArray *)&local_58);
    pQVar1 = this_00->udpData;
    qVar5 = QUdpSocket::writeDatagram
                      (pQVar1->udpSocket,(QByteArray *)&local_78,&pQVar1->associateAddress,
                       pQVar1->associatePort);
    if (qVar5 != local_78.size) {
      SVar4 = QAbstractSocket::error(&this_00->udpData->udpSocket->super_QAbstractSocket);
      len = -1;
      if (SVar4 == DatagramTooLargeError) {
        SVar4 = QAbstractSocket::error(&this_00->udpData->udpSocket->super_QAbstractSocket);
        QIODevice::errorString();
        QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,SVar4,(QString *)&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      }
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
  else {
    len = -1;
  }
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
LAB_00221c95:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return len;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::writeDatagram(const char *data, qint64 len, const QIpPacketHeader &header)
{
#ifndef QT_NO_UDPSOCKET
    Q_D(QSocks5SocketEngine);

    // it is possible to send with out first binding with udp, but socks5 requires a bind.
    if (!d->data) {
        d->initialize(QSocks5SocketEnginePrivate::UdpAssociateMode);
        // all udp needs to be bound
        if (!bind(QHostAddress("0.0.0.0"_L1), 0)) {
            //### set error
            return -1;
        }
    }

    QByteArray outBuf;
    outBuf.reserve(270 + len);
    outBuf.append(3, '\0');
    if (!qt_socks5_set_host_address_and_port(header.destinationAddress, header.destinationPort, &outBuf)) {
        QSOCKS5_DEBUG << "error setting address" << header.destinationAddress << " : "
                      << header.destinationPort;
        //### set error code ....
        return -1;
    }
    outBuf += QByteArray(data, len);
    QSOCKS5_DEBUG << "sending" << dump(outBuf);
    QByteArray sealedBuf;
    if (!d->data->authenticator->seal(outBuf, &sealedBuf)) {
        QSOCKS5_DEBUG << "sealing data failed";
        setError(QAbstractSocket::SocketAccessError, d->data->authenticator->errorString());
        return -1;
    }
    if (d->udpData->udpSocket->writeDatagram(sealedBuf, d->udpData->associateAddress, d->udpData->associatePort) != sealedBuf.size()) {
        //### try frgamenting
        if (d->udpData->udpSocket->error() == QAbstractSocket::DatagramTooLargeError)
            setError(d->udpData->udpSocket->error(), d->udpData->udpSocket->errorString());
        //### else maybe more serious error
        return -1;
    }

    return len;
#else
    Q_UNUSED(data);
    Q_UNUSED(len);
    Q_UNUSED(header);
    return -1;
#endif // QT_NO_UDPSOCKET
}